

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::TypeBuilder::Impl::Impl(Impl *this,size_t n)

{
  allocator_type local_21;
  
  anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::Store(&this->typeStore);
  (this->recGroups).
  super__Vector_base<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->recGroups).
  super__Vector_base<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->recGroups).
  super__Vector_base<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>::
  vector(&this->entries,n,&local_21);
  return;
}

Assistant:

Impl(size_t n) : entries(n) {}